

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  ostream *poVar1;
  undefined8 uVar2;
  bool bVar3;
  char *str;
  char *in_RDX;
  Int32 IVar4;
  undefined1 auVar5 [8];
  undefined1 local_78 [32];
  undefined1 local_58 [8];
  string env_var;
  Int32 local_2c [2];
  Int32 result;
  
  FlagToEnvVar_abi_cxx11_((string *)local_58,(internal *)flag,in_RDX);
  auVar5 = local_58;
  str = getenv((char *)local_58);
  IVar4 = default_value;
  if (str != (char *)0x0) {
    local_2c[0] = default_value;
    Message::Message((Message *)local_78);
    uVar2 = local_78._0_8_;
    poVar1 = (ostream *)(local_78._0_8_ + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Environment variable ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(char *)local_58,(long)env_var._M_dataplus._M_p);
    bVar3 = ParseInt32((Message *)local_78,str,local_2c);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar2 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)uVar2 + 8))(uVar2);
    }
    auVar5 = local_58;
    IVar4 = local_2c[0];
    if (!bVar3) {
      Message::Message((Message *)((long)&env_var.field_2 + 8));
      std::ostream::operator<<((ostream *)(env_var.field_2._8_8_ + 0x10),default_value);
      StringStreamToString((string *)local_78,(stringstream *)env_var.field_2._8_8_);
      printf("The default value %s is used.\n",local_78._0_8_);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_);
      }
      if (env_var.field_2._8_8_ != 0) {
        (**(code **)(*(long *)env_var.field_2._8_8_ + 8))(env_var.field_2._8_8_);
      }
      fflush(_stdout);
      auVar5 = local_58;
      IVar4 = default_value;
    }
  }
  if (auVar5 != (undefined1  [8])&env_var._M_string_length) {
    operator_delete((void *)auVar5);
  }
  return IVar4;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}